

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcfastdec.c
# Opt level: O2

int hevc_fast_dec_decode(uint8_t *bs,uint64_t bs_len,int64_t pts,void *fd_ctx,FdOutContext *out)

{
  undefined1 auStack_58 [8];
  FDFrame frame;
  
  if (fd_ctx != (void *)0x0) {
    *(int64_t *)((long)fd_ctx + 0x1398) = pts;
    *(uint64_t *)((long)fd_ctx + 0x13a0) = bs_len;
    *(uint8_t **)((long)fd_ctx + 0x13a8) = bs;
    frame.pic_type = 0;
    frame.pic_struct = 0;
    frame.pkt_pts = 0;
    frame.pkt_dts = 0;
    frame.line_size[2] = 0;
    frame.line_size[3] = 0;
    frame.width = 0;
    frame.height = 0;
    frame.data[3] = (uint8_t *)0x0;
    frame.line_size[0] = 0;
    frame.line_size[1] = 0;
    frame.data[1] = (uint8_t *)0x0;
    frame.data[2] = (uint8_t *)0x0;
    auStack_58 = (undefined1  [8])0x0;
    frame.data[0] = (uint8_t *)0x0;
    fd_hevc_decode_frame_single((HEVCContext *)fd_ctx,(FDFrame *)auStack_58,&out->got_frame);
    return 0;
  }
  return -1;
}

Assistant:

int hevc_fast_dec_decode(uint8_t *bs, uint64_t bs_len, int64_t pts, void *fd_ctx, FdOutContext *out)
{
    FDPacket pkt;
    FDFrame frame;
    if(fd_ctx == NULL)
        return -1;

    HEVCContext *h = (HEVCContext *)fd_ctx;
    pkt.data = bs;
    pkt.size = bs_len;
    pkt.pts = pts;
    h->input_pkt = pkt;
    memset(&frame, 0, sizeof(FDFrame));
    int ret = fd_hevc_decode_frame_single(h, &frame, &out->got_frame);
    if(ret >= 0)
    {
        //output
    }
    return 0;
}